

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O1

Matrix33<float> * __thiscall
Imath_3_2::Matrix33<float>::gjInverse
          (Matrix33<float> *__return_storage_ptr__,Matrix33<float> *this,bool singExc)

{
  ulong uVar1;
  undefined4 uVar2;
  float fVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 *puVar11;
  invalid_argument *this_00;
  float *pfVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  undefined8 *puVar18;
  long lVar19;
  undefined8 *puVar20;
  float *pfVar21;
  undefined8 *puVar22;
  long lVar23;
  long lVar24;
  float *pfVar25;
  long lVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  
  puVar11 = &local_58;
  local_58 = 0x3f800000;
  uStack_50 = 0;
  local_48 = 0x3f800000;
  uStack_40 = 0;
  local_38 = 1.0;
  pfVar12 = (float *)((long)&uStack_80 + 4);
  local_88 = *(undefined8 *)this->x[0];
  uStack_80 = *(undefined8 *)(this->x[0] + 2);
  local_78 = *(undefined8 *)(this->x[1] + 1);
  uStack_70 = *(undefined8 *)this->x[2];
  local_68 = this->x[2][2];
  fVar28 = __return_storage_ptr__->x[0][0];
  fVar29 = __return_storage_ptr__->x[0][1];
  fVar30 = __return_storage_ptr__->x[0][2];
  fVar31 = __return_storage_ptr__->x[1][0];
  fVar32 = __return_storage_ptr__->x[1][1];
  fVar35 = __return_storage_ptr__->x[1][2];
  fVar36 = __return_storage_ptr__->x[2][0];
  fVar33 = __return_storage_ptr__->x[2][1];
  fVar34 = __return_storage_ptr__->x[2][2];
  uVar16 = 1;
  lVar17 = -2;
  puVar18 = &local_88;
  lVar19 = (long)&uStack_50 + 4;
  uVar13 = 0;
  pfVar21 = pfVar12;
  do {
    if (uVar13 == 2) {
      __return_storage_ptr__->x[1][1] = fVar32;
      __return_storage_ptr__->x[1][2] = fVar35;
      __return_storage_ptr__->x[2][0] = fVar36;
      __return_storage_ptr__->x[2][1] = fVar33;
      __return_storage_ptr__->x[2][2] = fVar34;
      __return_storage_ptr__->x[0][0] = fVar28;
      __return_storage_ptr__->x[0][1] = fVar29;
      __return_storage_ptr__->x[0][2] = fVar30;
      __return_storage_ptr__->x[1][0] = fVar31;
      fVar29 = __return_storage_ptr__->x[0][1];
      fVar30 = __return_storage_ptr__->x[0][2];
      fVar31 = __return_storage_ptr__->x[1][0];
      fVar32 = __return_storage_ptr__->x[1][1];
      uVar4 = *(undefined8 *)(__return_storage_ptr__->x[1] + 2);
      fVar35 = (float)uVar4;
      fVar36 = (float)((ulong)uVar4 >> 0x20);
      puVar11 = &uStack_70;
      lVar19 = 2;
      puVar18 = &uStack_40;
      break;
    }
    uVar1 = uVar13 + 1;
    fVar38 = *(float *)(&local_88 + uVar13 * 2);
    fVar39 = -fVar38;
    if (-fVar38 <= fVar38) {
      fVar39 = fVar38;
    }
    uVar14 = uVar13 & 0xffffffff;
    lVar23 = lVar17;
    pfVar25 = pfVar21;
    do {
      fVar38 = *pfVar25;
      fVar37 = -fVar38;
      if (-fVar38 <= fVar38) {
        fVar37 = fVar38;
      }
      if (fVar39 < fVar37) {
        uVar14 = (ulong)((int)lVar23 + 3);
        fVar39 = fVar37;
      }
      pfVar25 = pfVar25 + 3;
      lVar23 = lVar23 + 1;
    } while (lVar23 != 0);
    if ((fVar39 != 0.0) || (NAN(fVar39))) {
      uVar15 = uVar16;
      lVar23 = lVar19;
      pfVar25 = pfVar12;
      if (uVar13 != uVar14) {
        lVar26 = (long)(int)uVar14 * 0xc;
        lVar24 = 0;
        do {
          uVar2 = *(undefined4 *)((long)puVar18 + lVar24 * 4);
          *(undefined4 *)((long)puVar18 + lVar24 * 4) =
               *(undefined4 *)((long)&local_88 + lVar24 * 4 + lVar26);
          *(undefined4 *)((long)&local_88 + lVar24 * 4 + lVar26) = uVar2;
          uVar2 = *(undefined4 *)((long)puVar11 + lVar24 * 4);
          *(undefined4 *)((long)puVar11 + lVar24 * 4) =
               *(undefined4 *)((long)&local_58 + lVar24 * 4 + lVar26);
          *(undefined4 *)((long)&local_58 + lVar24 * 4 + lVar26) = uVar2;
          lVar24 = lVar24 + 1;
        } while (lVar24 != 3);
      }
      do {
        fVar38 = -*(float *)((long)&local_88 + uVar13 * 4 + uVar15 * 0xc) /
                 *(float *)(&local_88 + uVar13 * 2);
        lVar26 = 0;
        do {
          fVar37 = *(float *)((long)puVar11 + lVar26);
          fVar3 = *(float *)(lVar23 + lVar26);
          *(float *)((long)pfVar25 + lVar26) =
               *(float *)((long)puVar18 + lVar26) * fVar38 + *(float *)((long)pfVar25 + lVar26);
          *(float *)(lVar23 + lVar26) = fVar37 * fVar38 + fVar3;
          lVar26 = lVar26 + 4;
        } while (lVar26 != 0xc);
        bVar27 = uVar15 < 2;
        uVar15 = uVar15 + 1;
        lVar23 = lVar23 + 0xc;
        pfVar25 = pfVar25 + 3;
        fVar38 = fVar34;
        fVar37 = fVar28;
        fVar3 = fVar29;
        fVar5 = fVar30;
        fVar6 = fVar31;
        fVar7 = fVar32;
        fVar8 = fVar35;
        fVar9 = fVar36;
        fVar10 = fVar33;
      } while (bVar27);
    }
    else {
      fVar38 = 1.0;
      fVar37 = 1.0;
      fVar3 = 0.0;
      fVar5 = 0.0;
      fVar6 = 0.0;
      fVar7 = 1.0;
      fVar8 = 0.0;
      fVar9 = 0.0;
      fVar10 = 0.0;
      if (singExc) {
        __return_storage_ptr__->x[1][1] = fVar32;
        __return_storage_ptr__->x[1][2] = fVar35;
        __return_storage_ptr__->x[2][0] = fVar36;
        __return_storage_ptr__->x[2][1] = fVar33;
        __return_storage_ptr__->x[2][2] = fVar34;
        __return_storage_ptr__->x[0][0] = fVar28;
        __return_storage_ptr__->x[0][1] = fVar29;
        __return_storage_ptr__->x[0][2] = fVar30;
        __return_storage_ptr__->x[1][0] = fVar31;
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
        goto LAB_00149d1d;
      }
    }
    fVar33 = fVar10;
    fVar36 = fVar9;
    fVar35 = fVar8;
    fVar32 = fVar7;
    fVar31 = fVar6;
    fVar30 = fVar5;
    fVar29 = fVar3;
    fVar28 = fVar37;
    fVar34 = fVar38;
    uVar16 = uVar16 + 1;
    pfVar21 = pfVar21 + 4;
    lVar17 = lVar17 + 1;
    puVar18 = (undefined8 *)((long)puVar18 + 0xc);
    puVar11 = (undefined8 *)((long)puVar11 + 0xc);
    pfVar12 = pfVar12 + 3;
    lVar19 = lVar19 + 0xc;
    uVar13 = uVar1;
    if ((fVar39 == 0.0) && (!NAN(fVar39))) {
      __return_storage_ptr__->x[1][1] = fVar32;
      __return_storage_ptr__->x[1][2] = fVar35;
      __return_storage_ptr__->x[2][0] = fVar36;
      __return_storage_ptr__->x[2][1] = fVar33;
      __return_storage_ptr__->x[2][2] = fVar34;
      __return_storage_ptr__->x[0][0] = fVar28;
      __return_storage_ptr__->x[0][1] = fVar29;
      __return_storage_ptr__->x[0][2] = fVar30;
      __return_storage_ptr__->x[1][0] = fVar31;
      return __return_storage_ptr__;
    }
  } while( true );
LAB_00149b5d:
  fVar38 = *(float *)(&local_88 + lVar19 * 2);
  if ((fVar38 != 0.0) || (NAN(fVar38))) {
    lVar17 = 0;
    do {
      *(float *)((long)puVar11 + lVar17 * 4) = *(float *)((long)puVar11 + lVar17 * 4) / fVar38;
      *(float *)((long)puVar18 + lVar17 * 4) = *(float *)((long)puVar18 + lVar17 * 4) / fVar38;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    if (lVar19 != 0) {
      lVar17 = 0;
      puVar20 = &local_58;
      puVar22 = &local_88;
      do {
        fVar39 = -*(float *)((long)&local_88 + lVar19 * 4 + lVar17 * 0xc);
        lVar23 = 0;
        do {
          fVar37 = *(float *)((long)puVar18 + lVar23);
          fVar3 = *(float *)((long)puVar20 + lVar23);
          *(float *)((long)puVar22 + lVar23) =
               *(float *)((long)puVar11 + lVar23) * fVar39 + *(float *)((long)puVar22 + lVar23);
          *(float *)((long)puVar20 + lVar23) = fVar37 * fVar39 + fVar3;
          lVar23 = lVar23 + 4;
        } while (lVar23 != 0xc);
        lVar17 = lVar17 + 1;
        puVar22 = (undefined8 *)((long)puVar22 + 0xc);
        puVar20 = (undefined8 *)((long)puVar20 + 0xc);
      } while (lVar17 != lVar19);
    }
  }
  else {
    if (singExc) {
      __return_storage_ptr__->x[2][2] = fVar34;
      __return_storage_ptr__->x[0][1] = fVar29;
      __return_storage_ptr__->x[0][2] = fVar30;
      __return_storage_ptr__->x[1][0] = fVar31;
      __return_storage_ptr__->x[1][1] = fVar32;
      *(ulong *)(__return_storage_ptr__->x[1] + 2) = CONCAT44(fVar36,fVar35);
      __return_storage_ptr__->x[2][1] = fVar33;
      __return_storage_ptr__->x[0][0] = fVar28;
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
LAB_00149d1d:
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    fVar35 = 0.0;
    fVar36 = 0.0;
    fVar33 = 0.0;
    fVar34 = 1.0;
    fVar28 = 1.0;
    fVar29 = 0.0;
    fVar30 = 0.0;
    fVar31 = 0.0;
    fVar32 = 1.0;
  }
  if ((fVar38 == 0.0) && (!NAN(fVar38))) {
    __return_storage_ptr__->x[2][2] = fVar34;
    __return_storage_ptr__->x[0][1] = fVar29;
    __return_storage_ptr__->x[0][2] = fVar30;
    __return_storage_ptr__->x[1][0] = fVar31;
    __return_storage_ptr__->x[1][1] = fVar32;
    __return_storage_ptr__->x[1][2] = fVar35;
    __return_storage_ptr__->x[2][0] = fVar36;
    __return_storage_ptr__->x[2][1] = fVar33;
    __return_storage_ptr__->x[0][0] = fVar28;
    return __return_storage_ptr__;
  }
  puVar11 = (undefined8 *)((long)puVar11 + -0xc);
  puVar18 = (undefined8 *)((long)puVar18 + -0xc);
  bVar27 = lVar19 == 0;
  lVar19 = lVar19 + -1;
  if (bVar27) {
    __return_storage_ptr__->x[2][2] = fVar34;
    __return_storage_ptr__->x[0][1] = fVar29;
    __return_storage_ptr__->x[0][2] = fVar30;
    __return_storage_ptr__->x[1][0] = fVar31;
    __return_storage_ptr__->x[1][1] = fVar32;
    __return_storage_ptr__->x[1][2] = fVar35;
    __return_storage_ptr__->x[2][0] = fVar36;
    __return_storage_ptr__->x[2][1] = fVar33;
    __return_storage_ptr__->x[0][0] = fVar28;
    *(undefined8 *)__return_storage_ptr__->x[0] = local_58;
    *(undefined8 *)(__return_storage_ptr__->x[0] + 2) = uStack_50;
    *(undefined8 *)(__return_storage_ptr__->x[1] + 1) = local_48;
    *(undefined8 *)__return_storage_ptr__->x[2] = uStack_40;
    __return_storage_ptr__->x[2][2] = local_38;
    return __return_storage_ptr__;
  }
  goto LAB_00149b5d;
}

Assistant:

inline Matrix33<T>
Matrix33<T>::gjInverse (bool singExc) const
{
    int      i, j, k;
    Matrix33 s;
    Matrix33 t (*this);

    // Forward elimination

    for (i = 0; i < 2; i++)
    {
        int pivot = i;

        T pivotsize = t.x[i][i];

        if (pivotsize < 0) pivotsize = -pivotsize;

        for (j = i + 1; j < 3; j++)
        {
            T tmp = t.x[j][i];

            if (tmp < 0) tmp = -tmp;

            if (tmp > pivotsize)
            {
                pivot     = j;
                pivotsize = tmp;
            }
        }

        if (pivotsize == 0)
        {
            if (singExc)
                throw std::invalid_argument ("Cannot invert singular matrix.");

            return Matrix33 ();
        }

        if (pivot != i)
        {
            for (j = 0; j < 3; j++)
            {
                T tmp;

                tmp           = t.x[i][j];
                t.x[i][j]     = t.x[pivot][j];
                t.x[pivot][j] = tmp;

                tmp           = s.x[i][j];
                s.x[i][j]     = s.x[pivot][j];
                s.x[pivot][j] = tmp;
            }
        }

        for (j = i + 1; j < 3; j++)
        {
            T f = t.x[j][i] / t.x[i][i];

            for (k = 0; k < 3; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    // Backward substitution

    for (i = 2; i >= 0; --i)
    {
        T f;

        if ((f = t[i][i]) == 0)
        {
            if (singExc)
                throw std::invalid_argument ("Cannot invert singular matrix.");

            return Matrix33 ();
        }

        for (j = 0; j < 3; j++)
        {
            t.x[i][j] /= f;
            s.x[i][j] /= f;
        }

        for (j = 0; j < i; j++)
        {
            f = t.x[j][i];

            for (k = 0; k < 3; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    return s;
}